

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* phosg::split_args(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *__return_storage_ptr__,string *s)

{
  ulong uVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  runtime_error *prVar5;
  char __c;
  ulong uVar6;
  char cVar7;
  char cVar8;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = true;
  uVar6 = 0;
  cVar7 = '\0';
  do {
    uVar1 = s->_M_string_length;
    if (uVar1 <= uVar6) {
      if (cVar7 != '\0') {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error(prVar5,"unterminated quoted string");
        __cxa_throw(prVar5,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
      }
      return __return_storage_ptr__;
    }
    pcVar2 = (s->_M_dataplus)._M_p;
    __c = pcVar2[uVar6];
    if (cVar7 == '\0') {
      cVar8 = __c;
      if (((__c != '\0') && (__c != '\"')) && (__c != '\'')) {
        if (__c == '\\') {
          if (uVar1 <= uVar6 + 1) {
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::runtime_error::runtime_error(prVar5,"incomplete escape sequence");
LAB_0010760e:
            __cxa_throw(prVar5,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error)
            ;
          }
LAB_00107558:
          uVar6 = uVar6 + 1;
          __c = pcVar2[uVar6];
          goto LAB_0010755c;
        }
        iVar4 = isblank((int)__c);
        if (iVar4 != 0) {
          if (!bVar3) {
            bVar3 = true;
          }
          goto LAB_0010757f;
        }
LAB_00107584:
        if (bVar3) {
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::emplace_back<>(__return_storage_ptr__);
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((__return_storage_ptr__->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish + -1,__c);
          bVar3 = false;
          cVar8 = cVar7;
        }
        else {
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((__return_storage_ptr__->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish + -1,__c);
          cVar8 = cVar7;
        }
      }
    }
    else if (__c == cVar7) {
LAB_0010757f:
      cVar8 = '\0';
    }
    else {
      if (__c == '\\') {
        if (uVar1 <= uVar6 + 1) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error(prVar5,"incomplete escape sequence");
          goto LAB_0010760e;
        }
        goto LAB_00107558;
      }
LAB_0010755c:
      cVar8 = cVar7;
      if (__c != '\0') goto LAB_00107584;
    }
    uVar6 = uVar6 + 1;
    cVar7 = cVar8;
  } while( true );
}

Assistant:

vector<string> split_args(const string& s) {
  vector<string> ret;
  char current_quote = 0;
  bool in_space_between_args = true;

  for (size_t z = 0; z < s.size(); z++) {
    bool can_be_space = true;
    char to_write = 0;
    if (current_quote) {
      can_be_space = false;
      if (s[z] == current_quote) {
        current_quote = 0;
      } else if (s[z] == '\\') {
        z++;
        if (z >= s.size()) {
          throw runtime_error("incomplete escape sequence");
        }
        to_write = s[z];
      } else {
        to_write = s[z];
      }
    } else if ((s[z] == '\"') || (s[z] == '\'')) {
      current_quote = s[z];
    } else if (s[z] == '\\') {
      can_be_space = false;
      z++;
      if (z >= s.size()) {
        throw runtime_error("incomplete escape sequence");
      }
      to_write = s[z];
    } else {
      to_write = s[z];
    }

    if (to_write) {
      bool is_space_between_args = can_be_space && isblank(to_write);
      if (is_space_between_args && in_space_between_args) {
        // Nothing
      } else if (!is_space_between_args && in_space_between_args) {
        // Start of another arg
        ret.emplace_back();
        if (to_write) {
          ret.back().push_back(to_write);
        }
        in_space_between_args = false;
      } else if (is_space_between_args && !in_space_between_args) {
        in_space_between_args = true;
      } else { // !is_space_between_args && !in_space_between_args
        ret.back().push_back(to_write);
      }
    }
  }

  if (current_quote) {
    throw runtime_error("unterminated quoted string");
  }

  return ret;
}